

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void checker(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar7 = (ulong)size;
  if ((long)uVar7 < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((P.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        lVar6 = (long)NAdjP[uVar4];
        if (NAdjP[uVar4] < NAdjP[uVar4 + 1]) {
          do {
            iVar3 = iVar3 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6]
                                    >> ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (NAdjP[uVar4 + 1] != lVar6);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar7);
    iVar3 = iVar3 >> 1;
  }
  if (iVar3 != CE_P_P) {
    __assert_fail("re_CE_P_P == CE_P_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x13b,"void checker()");
  }
  if (size < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        lVar6 = (long)NAdjP[uVar4];
        if (NAdjP[uVar4] < NAdjP[uVar4 + 1]) {
          do {
            iVar3 = iVar3 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6]
                                    >> ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (NAdjP[uVar4 + 1] != lVar6);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar7);
  }
  if (iVar3 != CE_Cp_P) {
    __assert_fail("re_CE_Cp_P == CE_Cp_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x141,"void checker()");
  }
  if (size < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        lVar6 = (long)NAdjP[uVar4];
        if (NAdjP[uVar4] < NAdjP[uVar4 + 1]) {
          do {
            iVar3 = iVar3 + (uint)((Cp.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar6] >> 6] >> ((long)NAdjB[lVar6] & 0x3fU)
                                   & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (NAdjP[uVar4 + 1] != lVar6);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar7);
    iVar3 = iVar3 >> 1;
  }
  if (iVar3 != CE_Cp_Cp) {
    __assert_fail("re_CE_Cp_Cp == CE_Cp_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x148,"void checker()");
  }
  if (size < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        lVar6 = (long)NAdjP[uVar4];
        if (NAdjP[uVar4] < NAdjP[uVar4 + 1]) {
          do {
            iVar3 = iVar3 + (uint)((Cp.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar6] >> 6] >> ((long)NAdjB[lVar6] & 0x3fU)
                                   & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (NAdjP[uVar4 + 1] != lVar6);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar7);
  }
  if (iVar3 != CE_Cm_Cp) {
    __assert_fail("re_CE_Cm_Cp == CE_Cm_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x14e,"void checker()");
  }
  if (size < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        lVar6 = (long)NAdjP[uVar4];
        if (NAdjP[uVar4] < NAdjP[uVar4 + 1]) {
          do {
            iVar3 = iVar3 + (uint)((Cm.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar6] >> 6] >> ((long)NAdjB[lVar6] & 0x3fU)
                                   & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (NAdjP[uVar4 + 1] != lVar6);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar7);
    iVar3 = iVar3 >> 1;
  }
  if (iVar3 == CE_Cm_Cm) {
    uVar4 = 0;
    uVar5 = 0;
    if (0 < size) {
      uVar5 = (ulong)(uint)size;
    }
    while (uVar4 != uVar5) {
      lVar6 = (long)AdjP[uVar4];
      iVar3 = 0;
      if (AdjP[uVar4] < AdjP[uVar4 + 1]) {
        iVar3 = 0;
        do {
          iVar2 = AdjB[lVar6];
          uVar8 = (ulong)(long)iVar2 >> 6;
          uVar9 = 1;
          if ((Cp.super__Base_bitset<235UL>._M_w[uVar8] >> ((long)iVar2 & 0x3fU) & 1) == 0) {
            uVar9 = (uint)((Cm.super__Base_bitset<235UL>._M_w[uVar8] & 1L << ((byte)iVar2 & 0x3f))
                          != 0);
          }
          iVar3 = iVar3 + uVar9;
          lVar6 = lVar6 + 1;
        } while (AdjP[uVar4 + 1] != lVar6);
      }
      piVar1 = neiC + uVar4;
      uVar4 = uVar4 + 1;
      if (iVar3 != *piVar1) {
        __assert_fail("re_neiC == neiC[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                      ,0x15b,"void checker()");
      }
    }
    uVar4 = 0;
    while (uVar4 != uVar5) {
      lVar6 = (long)AdjP[uVar4];
      iVar3 = 0;
      if (AdjP[uVar4] < AdjP[uVar4 + 1]) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)AdjB[lVar6] >> 6] >>
                                  ((long)AdjB[lVar6] & 0x3fU) & 1) != 0);
          lVar6 = lVar6 + 1;
        } while (AdjP[uVar4 + 1] != lVar6);
      }
      piVar1 = neiP + uVar4;
      uVar4 = uVar4 + 1;
      if (iVar3 != *piVar1) {
        __assert_fail("re_neiP == neiP[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                      ,0x162,"void checker()");
      }
    }
    if (size < 1) {
      iVar3 = 0;
    }
    else {
      uVar4 = 0;
      iVar3 = 0;
      do {
        uVar9 = 1;
        if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
          uVar9 = (uint)((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] & 1L << ((byte)uVar4 & 0x3f)
                         ) != 0);
        }
        iVar3 = iVar3 + uVar9;
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
    }
    if (iVar3 != sizeC) {
      __assert_fail("re_sizeC == sizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x168,"void checker()");
    }
    if (size < 1) {
      iVar3 = 0;
    }
    else {
      uVar4 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)((P.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1)
                              != 0);
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
    }
    if (iVar3 != sizeP) {
      __assert_fail("re_sizeP == sizeP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x16d,"void checker()");
    }
    return;
  }
  __assert_fail("re_CE_Cm_Cm == CE_Cm_Cm",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                ,0x155,"void checker()");
}

Assistant:

void checker() {
    /* CE_P_P */
    int re_CE_P_P = 0;
    for (int v = 0; v < size; ++v) if (P[v])
        FOR_C_NP(v, u) re_CE_P_P += 1;
    re_CE_P_P >>= 1;
    assert(re_CE_P_P == CE_P_P);

    /* CE_Cp_P */
    int re_CE_Cp_P = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NP(v, u) re_CE_Cp_P += 1;
    assert(re_CE_Cp_P == CE_Cp_P);

    /* CE_Cp_Cp */
    int re_CE_Cp_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cp_Cp;
    re_CE_Cp_Cp >>= 1;
    assert(re_CE_Cp_Cp == CE_Cp_Cp);

    /* CE_Cm_Cp */
    int re_CE_Cm_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cm_Cp;
    assert(re_CE_Cm_Cp == CE_Cm_Cp);

    /* CE_Cm_Cm */
    int re_CE_Cm_Cm = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cm[u]) ++re_CE_Cm_Cm;
    re_CE_Cm_Cm >>= 1;
    assert(re_CE_Cm_Cm == CE_Cm_Cm);

    /* neiC */
    for (int v = 0; v < size; ++v) {
        int re_neiC = 0;
        FOR_NC(v, u) re_neiC += 1;
        assert(re_neiC == neiC[v]);
    }

    /* neiP */
    for (int v = 0; v < size; ++v) {
        int re_neiP = 0;
        FOR_NP(v, u) re_neiP += 1;
        assert(re_neiP == neiP[v]);
    }

    /* sizeC */
    int re_sizeC = 0;
    for (int v = 0; v < size; ++v) if(Cm[v] || Cp[v]) ++re_sizeC;
    assert(re_sizeC == sizeC);

    /* sizeP */
    int re_sizeP = 0;
    for (int v = 0; v < size; ++v) if (P[v]) ++re_sizeP;
    assert(re_sizeP == sizeP);
}